

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  unsigned_long_long uVar1;
  ZSTD_ErrorCode ZVar2;
  size_t sVar3;
  size_t srcSize_00;
  XXH64_hash_t XVar4;
  byte *src_00;
  ZSTD_format_e ZVar5;
  byte *pbVar6;
  byte *dst_00;
  size_t err_code;
  ulong uVar7;
  bool bVar8;
  size_t local_90;
  uint *local_88;
  byte *local_80;
  blockProperties_t local_6c;
  byte *local_60;
  XXH64_state_t *local_58;
  byte *local_50;
  void *local_48;
  size_t local_40;
  size_t local_38;
  
  local_50 = (byte *)dst;
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x428,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  ZVar5 = dctx->format;
  if (ZVar5 < 2) {
    local_58 = &dctx->xxhState;
    srcSize_00 = 0;
    local_80 = local_50;
    do {
      while( true ) {
        if (srcSize < (ulong)(ZVar5 == ZSTD_f_zstd1) * 4 + 1) {
          if (srcSize != 0) {
            return 0xffffffffffffffb8;
          }
          return (long)local_80 - (long)local_50;
        }
        if ((srcSize < 4) || ((*src & 0xfffffff0) != 0x184d2a50)) break;
        if (srcSize < 8) {
          return 0xffffffffffffffb8;
        }
        if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
          return 0xfffffffffffffff2;
        }
        uVar7 = (ulong)*(uint *)((long)src + 4) + 8;
        if (srcSize < uVar7) {
          uVar7 = 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar7) {
          return uVar7;
        }
        bVar8 = srcSize < uVar7;
        srcSize = srcSize - uVar7;
        if (bVar8) {
          __assert_fail("skippableSize <= srcSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x44e,
                        "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                       );
        }
        src = (void *)((long)src + uVar7);
      }
      local_40 = dictSize;
      local_38 = srcSize_00;
      if (ddict == (ZSTD_DDict *)0x0) {
        sVar3 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
        if (0xffffffffffffff88 < sVar3) {
          return sVar3;
        }
      }
      else {
        ZSTD_decompressBegin_usingDDict(dctx,ddict);
      }
      local_48 = dict;
      ZSTD_checkContinuity(dctx,local_80,dstCapacity);
      ZVar5 = dctx->format;
      if (srcSize < (ulong)(ZVar5 == ZSTD_f_zstd1) * 4 + 5) {
LAB_0020fa3e:
        uVar7 = 0xffffffffffffffb8;
      }
      else {
        sVar3 = ZSTD_frameHeaderSize_internal(src,(ulong)(ZVar5 == ZSTD_f_zstd1) * 4 + 1,ZVar5);
        uVar7 = sVar3;
        if (sVar3 < 0xffffffffffffff89) {
          if (srcSize < sVar3 + 3) goto LAB_0020fa3e;
          uVar7 = ZSTD_decodeFrameHeader(dctx,src,sVar3);
          if (uVar7 < 0xffffffffffffff89) {
            local_88 = (uint *)(sVar3 + (long)src);
            local_90 = srcSize - sVar3;
            srcSize_00 = ZSTD_getcBlockSize(local_88,local_90,&local_6c);
            uVar7 = srcSize_00;
            if (srcSize_00 < 0xffffffffffffff89) {
              local_60 = local_80 + dstCapacity;
              dst_00 = local_80;
              do {
                uVar7 = local_90 - 3;
                local_90 = uVar7 - srcSize_00;
                if (uVar7 < srcSize_00) {
                  uVar7 = 0xffffffffffffffb8;
                  break;
                }
                src_00 = (byte *)((long)local_88 + 3);
                pbVar6 = local_60;
                if (src_00 < local_60) {
                  pbVar6 = src_00;
                }
                if (src_00 < dst_00) {
                  pbVar6 = local_60;
                }
                if (local_6c.blockType == bt_compressed) {
                  uVar7 = ZSTD_decompressBlock_internal
                                    (dctx,dst_00,(long)pbVar6 - (long)dst_00,src_00,srcSize_00,1,
                                     not_streaming);
                  if (0xffffffffffffff88 < uVar7) break;
                }
                else if (local_6c.blockType == bt_rle) {
                  uVar7 = (ulong)local_6c.origSize;
                  if ((ulong)((long)pbVar6 - (long)dst_00) < uVar7) {
LAB_0020fcc8:
                    uVar7 = 0xffffffffffffffba;
                    break;
                  }
                  if (dst_00 == (byte *)0x0) {
                    if (uVar7 != 0) {
LAB_0020fd01:
                      uVar7 = 0xffffffffffffffb6;
                      break;
                    }
                    uVar7 = 0;
                  }
                  else {
                    memset(dst_00,(uint)*src_00,uVar7);
                  }
                }
                else {
                  if (local_6c.blockType != bt_raw) {
                    uVar7 = 0xffffffffffffffec;
                    break;
                  }
                  if ((ulong)((long)local_60 - (long)dst_00) < srcSize_00) goto LAB_0020fcc8;
                  if (dst_00 == (byte *)0x0) {
                    if (srcSize_00 != 0) goto LAB_0020fd01;
                    uVar7 = 0;
                  }
                  else {
                    memmove(dst_00,src_00,srcSize_00);
                    uVar7 = srcSize_00;
                  }
                }
                if (dctx->validateChecksum != 0) {
                  ZSTD_XXH64_update(local_58,dst_00,uVar7);
                }
                dst_00 = dst_00 + uVar7;
                local_88 = (uint *)(src_00 + srcSize_00);
                if (local_6c.lastBlock != 0) {
                  uVar1 = (dctx->fParams).frameContentSize;
                  uVar7 = (long)dst_00 - (long)local_80;
                  if ((uVar1 != 0xffffffffffffffff) && (uVar7 != uVar1)) {
                    uVar7 = 0xffffffffffffffec;
                    break;
                  }
                  if ((dctx->fParams).checksumFlag != 0) {
                    if ((local_90 < 4) ||
                       ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum &&
                        (XVar4 = ZSTD_XXH64_digest(local_58), *local_88 != (uint)XVar4)))) {
                      uVar7 = 0xffffffffffffffea;
                      break;
                    }
                    local_88 = local_88 + 1;
                    local_90 = local_90 - 4;
                  }
                  ZSTD_DCtx_trace_end(dctx,uVar7,(long)local_88 - (long)src,0);
                  srcSize = local_90;
                  src = local_88;
                  break;
                }
                srcSize_00 = ZSTD_getcBlockSize(local_88,local_90,&local_6c);
                uVar7 = srcSize_00;
              } while (srcSize_00 < 0xffffffffffffff89);
            }
          }
        }
      }
      ZVar2 = ZSTD_getErrorCode(uVar7);
      sVar3 = 0xffffffffffffffb8;
      if ((((byte)local_38 & ZVar2 == ZSTD_error_prefix_unknown) != 0) ||
         (sVar3 = uVar7, 0xffffffffffffff88 < uVar7)) {
        return sVar3;
      }
      bVar8 = dstCapacity < uVar7;
      dstCapacity = dstCapacity - uVar7;
      if (bVar8) {
        __assert_fail("res <= dstCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x46d,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_80 = local_80 + uVar7;
      ZVar5 = dctx->format;
      srcSize_00 = CONCAT71((int7)(srcSize_00 >> 8),1);
      dictSize = local_40;
      dict = local_48;
    } while (ZVar5 < 2);
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                ,0xeb,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}